

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_celsius.cc
# Opt level: O1

void __thiscall hwtest::pgraph::MthdCelsiusLineWidth::emulate_mthd(MthdCelsiusLineWidth *this)

{
  pgraph_state *state;
  uint uVar1;
  uint uVar2;
  uint32_t err;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.celsius_config_c >> 6 & 4;
  uVar2 = (this->super_SingleMthdTest).super_MthdTest.val;
  err = uVar1 + 2;
  if (uVar2 < 0x200) {
    err = uVar1;
  }
  if (err != 0) {
    MthdTest::warn((MthdTest *)this,err);
    return;
  }
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar2 = (((uint)((this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.
                     super_Test.chipset.chipset != 0x10) << 8 | 0xff) & uVar2) << 0xc |
            (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster &
            0xffe00fff;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_raster = uVar2;
    pgraph_celsius_icmd(state,0x22,uVar2,true);
    return;
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		uint32_t err = 0;
		if (extr(exp.celsius_config_c, 8, 1))
			err |= 4;
		if (val >= 0x200)
			err |= 2;
		if (err) {
			warn(err);
		} else {
			if (!extr(exp.nsource, 1, 1)) {
				uint32_t rv = val & 0x1ff;
				if (chipset.chipset == 0x10)
					rv &= 0xff;
				insrt(exp.bundle_raster, 12, 9, rv);
				pgraph_celsius_icmd(&exp, 0x22, exp.bundle_raster, true);
			}
		}
	}